

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end_to_end_psnr_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_1072435::EndToEndTest::~EndToEndTest(EndToEndTest *this)

{
  libaom_test::EncoderTest::~EncoderTest(&this->super_EncoderTest);
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)this);
  return;
}

Assistant:

~EndToEndTest() override = default;